

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O2

void __thiscall Movegen::generate<(Movetype)10,(Piece)3>(Movegen *this)

{
  U64 UVar1;
  Square *s;
  U64 mvs;
  Square local_34;
  ulong local_30;
  
  for (s = this->rooks; *s != no_square; s = s + 1) {
    UVar1 = magics::attacks<(Piece)3>(&this->all_pieces,s);
    local_30 = UVar1 & this->qtarget;
    if (local_30 != 0) {
      local_34 = *s;
      encode<(Movetype)10>(this,&local_30,(int *)&local_34);
    }
  }
  return;
}

Assistant:

inline void Movegen::generate<quiet, rook>() {
	for (Square* s = &rooks[0]; *s != no_square; ++s) {
		U64 mvs = magics::attacks<rook>(all_pieces, *s) & qtarget;
		if (mvs != 0ULL) encode<quiet>(mvs, *s);
	}
}